

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STEPFile.h
# Opt level: O1

Object * Assimp::STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcCurveBoundedPlane,_3UL>::Construct
                   (DB *db,LIST *params)

{
  IfcCurveBoundedPlane *in;
  
  in = (IfcCurveBoundedPlane *)operator_new(0x90);
  *(undefined ***)&in->field_0x78 = &PTR__Object_00806870;
  *(undefined8 *)&in->field_0x80 = 0;
  *(char **)&in->field_0x88 = "IfcCurveBoundedPlane";
  Assimp::IFC::Schema_2x3::IfcBoundedSurface::IfcBoundedSurface
            ((IfcBoundedSurface *)in,&PTR_construction_vtable_24__00881e00);
  *(undefined8 *)&(in->super_IfcBoundedSurface).field_0x48 = 0;
  (in->super_IfcBoundedSurface).super_IfcSurface.super_IfcGeometricRepresentationItem.
  super_IfcRepresentationItem.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>._vptr_ObjectHelper =
       (_func_int **)&PTR__IfcCurveBoundedPlane_00881d20;
  *(undefined ***)&in->field_0x78 = &PTR__IfcCurveBoundedPlane_00881de8;
  *(undefined ***)
   &(in->super_IfcBoundedSurface).super_IfcSurface.super_IfcGeometricRepresentationItem.
    super_IfcRepresentationItem.
    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x10 =
       &PTR__IfcCurveBoundedPlane_00881d48;
  *(undefined ***)
   &(in->super_IfcBoundedSurface).super_IfcSurface.super_IfcGeometricRepresentationItem.
    super_IfcRepresentationItem.
    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x20 =
       &PTR__IfcCurveBoundedPlane_00881d70;
  *(undefined ***)
   &(in->super_IfcBoundedSurface).super_IfcSurface.super_IfcGeometricRepresentationItem.field_0x30 =
       &PTR__IfcCurveBoundedPlane_00881d98;
  *(undefined ***)&(in->super_IfcBoundedSurface).super_IfcSurface.field_0x40 =
       &PTR__IfcCurveBoundedPlane_00881dc0;
  *(undefined8 *)&(in->super_IfcBoundedSurface).field_0x50 = 0;
  (in->OuterBoundary).obj = (LazyObject *)0x0;
  (in->InnerBoundaries).
  super_vector<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcCurve>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcCurve>_>_>
  .
  super__Vector_base<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcCurve>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcCurve>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (in->InnerBoundaries).
  super_vector<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcCurve>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcCurve>_>_>
  .
  super__Vector_base<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcCurve>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcCurve>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (in->InnerBoundaries).
  super_vector<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcCurve>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcCurve>_>_>
  .
  super__Vector_base<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcCurve>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcCurve>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  GenericFill<Assimp::IFC::Schema_2x3::IfcCurveBoundedPlane>(db,params,in);
  return (Object *)
         ((long)&(in->super_IfcBoundedSurface).super_IfcSurface.super_IfcGeometricRepresentationItem
                 .super_IfcRepresentationItem.
                 super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.
                 _vptr_ObjectHelper +
         (long)(in->super_IfcBoundedSurface).super_IfcSurface.super_IfcGeometricRepresentationItem.
               super_IfcRepresentationItem.
               super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.
               _vptr_ObjectHelper[0xfffffffffffffffd]);
}

Assistant:

static Object* Construct(const STEP::DB& db, const EXPRESS::LIST& params) {
            // make sure we don't leak if Fill() throws an exception
            std::unique_ptr<TDerived> impl(new TDerived());

            // GenericFill<T> is undefined so we need to have a specialization
            const size_t num_args = GenericFill<TDerived>(db,params,&*impl);
            (void)num_args;

            // the following check is commented because it will always trigger if
            // parts of the entities are generated with dummy wrapper code.
            // This is currently done to reduce the size of the loader
            // code.
            //if (num_args != params.GetSize() && impl->GetClassName() != "NotImplemented") {
            //  DefaultLogger::get()->debug("STEP: not all parameters consumed");
            //}
            return impl.release();
        }